

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphanage_tests.cpp
# Opt level: O1

bool orphanage_tests::EqualTxns
               (set<std::shared_ptr<const_CTransaction>,_std::less<std::shared_ptr<const_CTransaction>_>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *set_txns,
               vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
               *vec_txns)

{
  pointer ppVar1;
  _Base_ptr p_Var2;
  type *tx;
  pointer ppVar3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  void *__pu;
  _Base_ptr p_Var6;
  long in_FS_OFFSET;
  bool bVar7;
  bool bVar8;
  
  ppVar3 = (vec_txns->
           super__Vector_base<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (vec_txns->
           super__Vector_base<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (((long)ppVar1 - (long)ppVar3 >> 3) * -0x5555555555555555 -
      (set_txns->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    bVar8 = ppVar3 == ppVar1;
    if (!bVar8) {
      p_Var2 = (set_txns->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var4 = &(set_txns->_M_t)._M_impl.super__Rb_tree_header;
      do {
        p_Var5 = &p_Var4->_M_header;
        if (p_Var2 != (_Base_ptr)0x0) {
          p_Var6 = p_Var2;
          do {
            bVar7 = *(element_type **)(p_Var6 + 1) <
                    (ppVar3->first).
                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (!bVar7) {
              p_Var5 = p_Var6;
            }
            p_Var6 = (&p_Var6->_M_left)[bVar7];
          } while (p_Var6 != (_Base_ptr)0x0);
        }
        p_Var6 = &p_Var4->_M_header;
        if (((_Rb_tree_header *)p_Var5 != p_Var4) &&
           (p_Var6 = p_Var5,
           (ppVar3->first).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           < *(element_type **)(p_Var5 + 1))) {
          p_Var6 = &p_Var4->_M_header;
        }
        if ((_Rb_tree_header *)p_Var6 == p_Var4) break;
        ppVar3 = ppVar3 + 1;
        bVar8 = ppVar3 == ppVar1;
      } while (!bVar8);
    }
  }
  else {
    bVar8 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

static bool EqualTxns(const std::set<CTransactionRef>& set_txns,
                      const std::vector<std::pair<CTransactionRef, NodeId>>& vec_txns)
{
    if (vec_txns.size() != set_txns.size()) return false;
    for (const auto& [tx, nodeid] : vec_txns) {
        if (!set_txns.contains(tx)) return false;
    }
    return true;
}